

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::MapFieldGenerator::DetermineObjectiveCClassDefinitions
          (MapFieldGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *fwd_decls)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ObjectiveCType OVar2;
  Descriptor *this_00;
  FieldDescriptor *pFVar3;
  string local_60;
  undefined1 local_40 [32];
  
  this_00 = FieldDescriptor::message_type
                      ((this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                       super_SingleFieldGenerator.super_FieldGenerator.descriptor_);
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"value","");
  pFVar3 = Descriptor::FindFieldByName(this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (*(once_flag **)(pFVar3 + 0x18) != (once_flag *)0x0) {
    local_60._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_40._0_8_ = pFVar3;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar3 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_60,
               (FieldDescriptor **)local_40);
  }
  OVar2 = GetObjectiveCType((uint)(byte)pFVar3[2]);
  if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
    FieldGenerator::variable_abi_cxx11_
              ((string *)local_40,
               (this->value_field_generator_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>
               ._M_head_impl,"storage_type");
    ObjCClassDeclaration(&local_60,(string *)local_40);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)fwd_decls,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_40._0_8_ != (FieldDescriptor *)(local_40 + 0x10)) {
      operator_delete((void *)local_40._0_8_);
    }
  }
  return;
}

Assistant:

void MapFieldGenerator::DetermineObjectiveCClassDefinitions(
    std::set<std::string>* fwd_decls) const {
  // Class name is already in "storage_type".
  const FieldDescriptor* value_descriptor =
      descriptor_->message_type()->FindFieldByName("value");
  if (GetObjectiveCType(value_descriptor) == OBJECTIVECTYPE_MESSAGE) {
    fwd_decls->insert(ObjCClassDeclaration(
        value_field_generator_->variable("storage_type")));
  }
}